

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O2

double bfrac(double x,double a,double b,int *ctr)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double x_00;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 local_68;
  undefined8 local_28;
  undefined8 local_20;
  
  uVar1 = 1;
  dVar6 = 1.0;
  local_20 = 1.0;
  local_68 = 1.0;
  x_00 = 1.0;
  local_28 = 1.0 - ((a + b) * x) / (a + 1.0);
  while( true ) {
    dVar2 = eps(x_00);
    if ((local_68 <= dVar2 * 1000.0) || (999 < uVar1)) break;
    dVar5 = (double)(int)uVar1;
    dVar3 = dVar5 + a;
    dVar4 = dVar3 + dVar5;
    dVar2 = 1.0;
    if (uVar1 != 1) {
      dVar2 = local_28;
    }
    dVar5 = ((b - dVar5) * dVar5 * x) / ((dVar4 + -1.0) * dVar4);
    dVar3 = ((dVar3 + b) * -dVar3 * x) / ((dVar4 + 1.0) * dVar4);
    dVar7 = dVar6 * dVar5 + x_00;
    local_20 = dVar5 * local_20 + local_28;
    dVar4 = dVar3 * local_28 + local_20;
    dVar6 = dVar7 / dVar4;
    local_20 = local_20 / dVar4;
    dVar4 = (dVar3 * x_00 + dVar7) / dVar4;
    uVar1 = uVar1 + 1;
    local_68 = ABS(dVar4 - x_00);
    x_00 = dVar4;
    local_28 = dVar2;
  }
  *ctr = uVar1;
  return x_00;
}

Assistant:

double bfrac(double x,double a, double b, int* ctr) {
	double d2m,d2m1,a0,b0,a1,b1,am,bm,g,g0,delta,a1m,a2m,del;
	int m;
	
	/* This continued fraction computation is based on
	 * equation 26.5.8 Handbook of Mathematical Functions.
	 * by Abramowitz and Stegun. 
	 * If convergence is not achieved in 1000 iterations then
	 * the function will still return values so it is recommended
	 * that calling function 
	 * 
	 * y = bfrac(x,a,b,&controlint)
	 * 
	 * should check controlint and discard the result y
	 * if controlint = 1000.
	 * 
	 */ 
	 m = 1;
	 am = bm = g = 1.;
	 a0 = b0 = a1 = b1 = g0 = 0.;
	 del = 1. - (a+b) * x / (a+1);
	 delta = fabs(g - g0);
	 
	 while ( (delta > 1000*eps(g) ) && (m < 1000) ) {
		 a1m = (double) a + m;
		 a2m = (double) a1m + m;
		 g0 = g;
		 d2m = m * (b - m) * x / (a2m * (a2m - 1.));
		 d2m1 = - a1m * (a1m + b) * x / (a2m * (a2m + 1.));
		 
		 
		 a0 = g + d2m * am;
		 b0 = del + d2m * bm;
		 a1 = a0 + d2m1 * g;
		 b1 = b0 + d2m1 * del;
		 if (m == 1) {
			 del = 1.0;
		 }
		 
		 am = a0 / b1;
		 bm = b0 / b1;
		 g = a1/b1;
		 
		 m++;
		 delta = fabs(g - g0);
	 }
	 
	 *ctr = m;
	 return g;
}